

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

from_chars_result
duckdb_fast_float::from_chars<float>
          (char *first,char *last,float *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  from_chars_result fVar13;
  from_chars_result fVar14;
  from_chars_result fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  byte *pbVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  long lVar33;
  byte *pbVar34;
  ulong uVar35;
  long lVar36;
  byte *pbVar37;
  long lVar38;
  float fVar39;
  from_chars_result fVar40;
  adjusted_mantissa aVar41;
  
  if (first == last) {
    fVar40._8_8_ = 0x16;
    fVar40.ptr = first;
    return fVar40;
  }
  cVar1 = *first;
  pbVar23 = (byte *)first;
  if ((cVar1 == '-') &&
     ((pbVar23 = (byte *)(first + 1), pbVar23 == (byte *)last ||
      (*pbVar23 != decimal_separator && 9 < (byte)(*pbVar23 - 0x30))))) goto LAB_0125b60e;
  uVar35 = 0;
  pbVar26 = pbVar23;
  do {
    bVar2 = *pbVar26;
    if (9 < (byte)(bVar2 - 0x30)) {
      lVar36 = (long)pbVar26 - (long)pbVar23;
      if (bVar2 != decimal_separator) {
        pbVar37 = (byte *)0x0;
        pbVar25 = pbVar26;
        goto LAB_0125b50a;
      }
      pbVar37 = pbVar26 + 1;
      pbVar34 = pbVar26 + 9;
      pbVar25 = pbVar37;
      if ((pbVar34 <= last) &&
         (uVar28 = *(long *)pbVar37 + 0xcfcfcfcfcfcfcfd0,
         ((*(long *)pbVar37 + 0x4646464646464646U | uVar28) & 0x8080808080808080) == 0)) {
        uVar28 = (uVar28 >> 8) + uVar28 * 10;
        uVar35 = ((uVar28 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar28 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar35 * 100000000;
        pbVar25 = pbVar34;
        if ((pbVar26 + 0x11 <= last) &&
           (uVar28 = *(long *)pbVar34 + 0xcfcfcfcfcfcfcfd0,
           ((*(long *)pbVar34 + 0x4646464646464646U | uVar28) & 0x8080808080808080) == 0)) {
          uVar28 = uVar28 * 10 + (uVar28 >> 8);
          uVar35 = ((uVar28 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar28 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar35 * 100000000;
          pbVar25 = pbVar26 + 0x11;
        }
      }
      lVar38 = 0;
      goto LAB_0125b470;
    }
    pbVar25 = pbVar26 + 1;
    if (((pbVar25 != (byte *)last) && (*pbVar25 == 0x5f)) &&
       ((strict ||
        ((pbVar25 = pbVar26 + 2, pbVar25 == (byte *)last || (9 < (byte)(*pbVar25 - 0x30)))))))
    goto LAB_0125b60e;
    uVar35 = ((ulong)bVar2 + uVar35 * 10) - 0x30;
    pbVar26 = pbVar25;
  } while (pbVar25 != (byte *)last);
  lVar36 = (long)last - (long)pbVar23;
  pbVar37 = (byte *)0x0;
  pbVar26 = (byte *)last;
LAB_0125b50a:
  if (lVar36 == 0) goto LAB_0125b60e;
  if ((((fmt & scientific) == 0) || (pbVar25 == (byte *)last)) || ((*pbVar25 | 0x20) != 0x65)) {
    if ((fmt & general) == scientific) goto LAB_0125b60e;
LAB_0125b62b:
    lVar38 = 0;
  }
  else {
    pbVar34 = pbVar25 + 1;
    if (pbVar34 == (byte *)last) {
      bVar18 = false;
    }
    else if (*pbVar34 == 0x2d) {
      pbVar34 = pbVar25 + 2;
      bVar18 = true;
    }
    else {
      if (*pbVar34 == 0x2b) {
        pbVar34 = pbVar25 + 2;
      }
      bVar18 = false;
    }
    if ((pbVar34 == (byte *)last) || (9 < (byte)(*pbVar34 - 0x30))) {
      if ((fmt & fixed) == 0) goto LAB_0125b60e;
      goto LAB_0125b62b;
    }
    lVar38 = 0;
    do {
      lVar33 = lVar38;
      if (9 < (byte)(*pbVar34 - 0x30)) break;
      lVar33 = (ulong)(byte)(*pbVar34 - 0x30) + lVar38 * 10;
      if (0xffff < lVar38) {
        lVar33 = lVar38;
      }
      pbVar25 = pbVar34 + 1;
      if (((pbVar25 != (byte *)last) && (*pbVar25 == 0x5f)) &&
         ((strict ||
          ((pbVar25 = pbVar34 + 2, pbVar25 == (byte *)last || (9 < (byte)(*pbVar25 - 0x30)))))))
      goto LAB_0125b60e;
      pbVar34 = pbVar25;
      lVar38 = lVar33;
    } while (pbVar34 != (byte *)last);
    lVar38 = -lVar33;
    if (!bVar18) {
      lVar38 = lVar33;
    }
    pbVar37 = pbVar37 + lVar38;
    pbVar25 = pbVar34;
  }
  pbVar34 = pbVar23;
  if (lVar36 < 0x14) {
    bVar18 = false;
  }
  else {
    do {
      bVar2 = *pbVar34;
      if (bVar2 != 0x30 && bVar2 != decimal_separator) break;
      lVar36 = lVar36 - (ulong)(bVar2 == 0x30);
      pbVar34 = pbVar34 + 1;
    } while (pbVar34 != (byte *)last);
    if (lVar36 < 0x14) {
      bVar18 = false;
    }
    else {
      uVar35 = 0;
      do {
        bVar2 = *pbVar23;
        if (9 < (byte)(bVar2 - 0x30)) goto LAB_0125b740;
        pbVar37 = pbVar23 + 1;
        if (((pbVar37 != (byte *)last) && (*pbVar37 == 0x5f)) &&
           ((strict ||
            ((pbVar37 = pbVar23 + 2, pbVar37 == (byte *)last || (9 < (byte)(*pbVar37 - 0x30)))))))
        goto LAB_0125b60e;
        pbVar23 = pbVar37;
        uVar35 = ((ulong)bVar2 + uVar35 * 10) - 0x30;
      } while ((uVar35 < 1000000000000000000) && (pbVar23 != (byte *)last));
      if (uVar35 < 1000000000000000000) {
LAB_0125b740:
        pbVar23 = pbVar23 + 1;
        lVar36 = 0;
        pbVar26 = pbVar23;
        pbVar37 = pbVar23;
        if (pbVar23 != (byte *)last) {
          while (pbVar26 = pbVar37, (byte)(*pbVar37 - 0x30) < 10) {
            pbVar26 = pbVar37 + 1;
            if ((pbVar26 != (byte *)last) && (*pbVar26 == 0x5f)) {
              pbVar26 = pbVar37 + 2;
              if ((pbVar26 == (byte *)last) || (9 < (byte)(*pbVar26 - 0x30))) goto LAB_0125b60e;
              lVar36 = lVar36 + 1;
            }
            uVar35 = ((ulong)*pbVar37 + uVar35 * 10) - 0x30;
            if ((999999999999999999 < uVar35) || (pbVar37 = pbVar26, pbVar26 == (byte *)last))
            break;
          }
        }
        pbVar37 = pbVar23 + lVar36 + (lVar38 - (long)pbVar26);
      }
      else {
        pbVar37 = pbVar26 + (lVar38 - (long)pbVar23);
      }
      bVar18 = true;
    }
  }
  iVar20 = (int)pbVar37;
  if (pbVar37 + -0xb < (byte *)0xffffffffffffffeb) {
LAB_0125b7c0:
    if (uVar35 == 0) {
      uVar35 = 0;
LAB_0125b89f:
      uVar30 = 0;
    }
    else {
      if ((long)pbVar37 < -0x41) goto LAB_0125b89f;
      if ((long)pbVar37 < 0x27) goto LAB_0125b7f1;
      uVar30 = 0xff;
    }
    uVar19 = 0;
LAB_0125b8a5:
    if (!bVar18) goto LAB_0125b8ec;
LAB_0125b8aa:
    uVar35 = uVar35 + 1;
    uVar22 = 0;
    if ((long)pbVar37 < -0x41) {
LAB_0125b8d0:
      uVar24 = 0;
    }
    else {
      uVar24 = 0;
      uVar22 = 0;
      if (uVar35 != 0) {
        if (0x26 < (long)pbVar37) {
          uVar22 = 0xff;
          goto LAB_0125b8d0;
        }
        uVar28 = 0x3f;
        if (uVar35 != 0) {
          for (; uVar35 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        uVar35 = uVar35 << ((byte)(uVar28 ^ 0x3f) & 0x3f);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar35;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar20 * 2 + 0x2ac) * 8);
        auVar12 = auVar5 * auVar9;
        uVar27 = auVar12._8_8_;
        if ((~uVar27 & 0x3fffffffff) == 0) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar35;
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar20 * 2 + 0x2ad) * 8)
          ;
          uVar35 = SUB168(auVar6 * auVar10,8);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar35;
          auVar17 = auVar12 + auVar17;
          auVar12._8_8_ = uVar35;
          auVar12._0_8_ = auVar17._0_8_;
          uVar27 = auVar17._8_8_;
        }
        if ((pbVar37 + 0x1b < (byte *)0x53) || (auVar12._0_8_ != 0xffffffffffffffff)) {
          iVar20 = ((iVar20 * 0x3526a >> 0x10) - (int)(uVar28 ^ 0x3f)) - (int)((long)uVar27 >> 0x3f)
          ;
          iVar21 = iVar20 + 0xbe;
          bVar2 = (byte)(uVar27 >> 0x3f);
          uVar35 = uVar27 >> (bVar2 | 0x26);
          if (iVar21 < 1) {
            uVar22 = 1 - iVar21;
            if (0x3f < uVar22) {
              uVar22 = 0;
              goto LAB_0125b8d0;
            }
            uVar35 = (uVar35 >> ((byte)uVar22 & 0x3f)) +
                     (ulong)((uVar35 >> ((ulong)uVar22 & 0x3f) & 1) != 0);
            uVar24 = (uint)(uVar35 >> 1) & 0x7fffffff;
            uVar22 = (uint)(0xffffff < uVar35);
          }
          else {
            uVar28 = (ulong)((uint)uVar35 & 0x3fffffe);
            if (uVar35 << (bVar2 | 0x26) != uVar27 || ((uint)uVar35 & 3) != 1) {
              uVar28 = uVar35;
            }
            if (1 < auVar12._0_8_) {
              uVar28 = uVar35;
            }
            if ((byte *)0x1b < pbVar37 + 0x11) {
              uVar28 = uVar35;
            }
            uVar28 = ((uint)uVar28 & 1) + uVar28;
            uVar22 = (iVar20 + 0xbf) - (uint)(uVar28 < 0x2000000);
            uVar24 = (uint)(uVar28 >> 1) & 0x37fffff;
            if (0x1ffffff < uVar28) {
              uVar24 = 0;
            }
            if (0xfe < uVar22) {
              uVar24 = 0;
              uVar22 = 0xff;
            }
          }
        }
        else {
          uVar24 = 0;
          uVar22 = 0xffffffff;
        }
      }
    }
    if (((uVar19 == uVar24) && (-1 < (int)uVar30)) && (uVar30 == uVar22)) goto LAB_0125b8ec;
  }
  else {
    if (uVar35 < 0x1000001) {
      if (!bVar18) {
        if ((long)pbVar37 < 0) {
          fVar39 = (float)(long)uVar35 / *(float *)(powers_of_ten_float + (long)pbVar37 * -4);
        }
        else {
          fVar39 = (float)(long)uVar35 * *(float *)(powers_of_ten_float + (long)pbVar37 * 4);
        }
        fVar15._8_8_ = 0;
        fVar15.ptr = (char *)pbVar25;
        fVar14._8_8_ = 0;
        fVar14.ptr = (char *)pbVar25;
        *value = fVar39;
        if (cVar1 != '-') {
          return fVar14;
        }
        *value = -fVar39;
        return fVar15;
      }
      goto LAB_0125b7c0;
    }
LAB_0125b7f1:
    uVar28 = 0x3f;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar31 = uVar35 << ((byte)(uVar28 ^ 0x3f) & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar31;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar20 * 2 + 0x2ac) * 8);
    auVar11 = auVar3 * auVar7;
    uVar27 = auVar11._8_8_;
    if ((~uVar27 & 0x3fffffffff) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar31;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar20 * 2 + 0x2ad) * 8);
      uVar27 = SUB168(auVar4 * auVar8,8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar27;
      auVar16 = auVar11 + auVar16;
      auVar11._8_8_ = uVar27;
      auVar11._0_8_ = auVar16._0_8_;
      uVar27 = auVar16._8_8_;
    }
    if ((pbVar37 + 0x1b < (byte *)0x53) || (auVar11._0_8_ != 0xffffffffffffffff)) {
      iVar21 = ((iVar20 * 0x3526a >> 0x10) - (int)(uVar28 ^ 0x3f)) - (int)((long)uVar27 >> 0x3f);
      iVar29 = iVar21 + 0xbe;
      bVar2 = (byte)(uVar27 >> 0x3f);
      uVar28 = uVar27 >> (bVar2 | 0x26);
      if (iVar29 < 1) {
        uVar30 = 1 - iVar29;
        if (0x3f < uVar30) goto LAB_0125b89f;
        uVar28 = (uVar28 >> ((byte)uVar30 & 0x3f)) +
                 (ulong)((uVar28 >> ((ulong)uVar30 & 0x3f) & 1) != 0);
        uVar30 = (uint)(0xffffff < uVar28);
        uVar19 = (uint)(uVar28 >> 1) & 0x7fffffff;
      }
      else {
        uVar31 = (ulong)((uint)uVar28 & 0x3fffffe);
        if (uVar28 << (bVar2 | 0x26) != uVar27 || ((uint)uVar28 & 3) != 1) {
          uVar31 = uVar28;
        }
        if (1 < auVar11._0_8_) {
          uVar31 = uVar28;
        }
        if ((byte *)0x1b < pbVar37 + 0x11) {
          uVar31 = uVar28;
        }
        uVar31 = ((uint)uVar31 & 1) + uVar31;
        uVar30 = (iVar21 + 0xbf) - (uint)(uVar31 < 0x2000000);
        uVar19 = (uint)(uVar31 >> 1) & 0x37fffff;
        if (0x1ffffff < uVar31) {
          uVar19 = 0;
        }
        if (0xfe < uVar30) {
          uVar30 = 0xff;
          uVar19 = 0;
        }
      }
      goto LAB_0125b8a5;
    }
    if (bVar18) {
      uVar30 = 0xffffffff;
      uVar19 = 0;
      goto LAB_0125b8aa;
    }
  }
  aVar41 = parse_long_mantissa<duckdb_fast_float::binary_format<float>>(first,last);
  uVar19 = (uint)aVar41.mantissa;
  uVar30 = aVar41.power2;
LAB_0125b8ec:
  fVar32 = (float)(uVar19 | uVar30 << 0x17);
  fVar39 = (float)((uint)fVar32 | 0x80000000);
  if (cVar1 != '-') {
    fVar39 = fVar32;
  }
  *value = fVar39;
  fVar13._8_8_ = 0;
  fVar13.ptr = (char *)pbVar25;
  return fVar13;
  while( true ) {
    pbVar34 = pbVar25 + 1;
    do {
      if (9 < (byte)(pbVar34[-1] - 0x30)) {
        pbVar25 = pbVar34 + -1;
        goto LAB_0125b4f9;
      }
      uVar35 = (ulong)(byte)(pbVar34[-1] - 0x30) + uVar35 * 10;
      pbVar25 = (byte *)last;
      if (pbVar34 == (byte *)last) goto LAB_0125b4f9;
      pbVar25 = pbVar34 + 1;
      bVar2 = *pbVar34;
      pbVar34 = pbVar25;
    } while (bVar2 != 0x5f);
    if (((strict) || (pbVar25 == (byte *)last)) ||
       (lVar38 = lVar38 + 1, 9 < (byte)(*pbVar25 - 0x30))) break;
LAB_0125b470:
    if (pbVar25 == (byte *)last) {
LAB_0125b4f9:
      pbVar37 = pbVar37 + (lVar38 - (long)pbVar25);
      lVar36 = lVar36 - (long)pbVar37;
      goto LAB_0125b50a;
    }
  }
LAB_0125b60e:
  fVar40 = detail::parse_infnan<float>(first,last,value);
  return fVar40;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}